

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void copyPrintSslCertificate(X509 *cert0)

{
  char *size;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *this;
  StringRef *string_00;
  String string;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  X509Cert copyCert;
  X509Cert cert;
  X509 *in_stack_ffffffffffffff88;
  X509Cert *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffffa0;
  X509Cert *in_stack_ffffffffffffffa8;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_40;
  Handle local_18 [24];
  
  axl::cry::X509Cert::X509Cert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  axl::cry::X509Cert::X509Cert((X509Cert *)0x11783b);
  axl::cry::X509Cert::saveDer(in_stack_ffffffffffffffa8);
  size = axl::sl::Array::operator_cast_to_char_((Array *)&local_40);
  this = (Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *)
         axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(&local_40);
  axl::cry::X509Cert::loadDer(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(size_t)size);
  printf("DER-copy:\n");
  string_00 = (StringRef *)axl::sl::Handle::operator_cast_to_x509_st_(local_18);
  printSslCertificate((X509 *)string.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
                              _24_8_);
  axl::cry::X509Cert::savePem(in_stack_ffffffffffffffa8);
  axl::cry::X509Cert::loadPem((X509Cert *)this,string_00);
  printf("PEM-copy:\n");
  axl::sl::Handle::operator_cast_to_x509_st_(local_18);
  printSslCertificate((X509 *)string.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
                              _24_8_);
  axl::sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::detach(this);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x117918);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x117922);
  axl::cry::X509Cert::~X509Cert((X509Cert *)0x11792c);
  axl::cry::X509Cert::~X509Cert((X509Cert *)0x117936);
  return;
}

Assistant:

void
copyPrintSslCertificate(X509* cert0) {
	cry::X509Cert cert = cert0;
	cry::X509Cert copyCert;

	sl::Array<char> buffer = cert.saveDer();
	copyCert.loadDer(buffer, buffer.getCount());
	printf("DER-copy:\n");
	printSslCertificate(copyCert);

	sl::String string = cert.savePem();
	copyCert.loadPem(string);
	printf("PEM-copy:\n");
	printSslCertificate(copyCert);

	cert.detach();
}